

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TableLoadSettings(ImGuiTable *table)

{
  int iVar1;
  int iVar2;
  ImGuiTableColumnSettings *pIVar3;
  char *pcVar4;
  long in_RDI;
  bool bVar5;
  int column_n_1;
  ImGuiTableColumn *column;
  int column_n;
  int data_n;
  ImGuiTableColumnSettings *column_settings;
  ImGuiTableSettings *settings;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffc8;
  char cVar6;
  ImGuiID in_stack_ffffffffffffffcc;
  ImGuiTableColumn *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  ImChunkStream<ImGuiTableSettings> *in_stack_ffffffffffffffe0;
  ImGuiTableSettings *local_18;
  
  *(undefined1 *)(in_RDI + 0x1d9) = 0;
  if ((*(uint *)(in_RDI + 4) & 0x20) == 0) {
    if (*(int *)(in_RDI + 100) == -1) {
      local_18 = TableSettingsFindByID(in_stack_ffffffffffffffcc);
      if (local_18 == (ImGuiTableSettings *)0x0) {
        return;
      }
      iVar1 = ImChunkStream<ImGuiTableSettings>::offset_from_ptr
                        (in_stack_ffffffffffffffe0,
                         (ImGuiTableSettings *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      *(int *)(in_RDI + 100) = iVar1;
    }
    else {
      local_18 = TableGetBoundSettings
                           ((ImGuiTable *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    *(ImGuiTableFlags *)(in_RDI + 0x60) = local_18->SaveFlags;
    *(float *)(in_RDI + 0xe0) = local_18->RefScale;
    pIVar3 = ImGuiTableSettings::GetColumnSettings(local_18);
    for (iVar1 = 0; iVar1 < local_18->ColumnsCount; iVar1 = iVar1 + 1) {
      iVar2 = (int)pIVar3->Index;
      if ((-1 < iVar2) && (iVar2 < *(int *)(in_RDI + 0x6c))) {
        in_stack_ffffffffffffffd0 =
             ImSpan<ImGuiTableColumn>::operator[]
                       ((ImSpan<ImGuiTableColumn> *)in_stack_ffffffffffffffd0,
                        in_stack_ffffffffffffffcc);
        if ((local_18->SaveFlags & 1U) != 0) {
          if (((byte)pIVar3->field_0xb >> 3 & 1) == 0) {
            in_stack_ffffffffffffffd0->WidthRequest = pIVar3->WidthOrWeight;
          }
          else {
            in_stack_ffffffffffffffd0->WidthStretchWeight = pIVar3->WidthOrWeight;
          }
          in_stack_ffffffffffffffd0->AutoFitQueue = '\0';
        }
        if ((local_18->SaveFlags & 2U) == 0) {
          in_stack_ffffffffffffffd0->DisplayOrder = (ImS8)iVar2;
        }
        else {
          in_stack_ffffffffffffffd0->DisplayOrder = pIVar3->DisplayOrder;
        }
        bVar5 = ((byte)pIVar3->field_0xb >> 2 & 1) != 0;
        in_stack_ffffffffffffffd0->IsVisibleNextFrame = bVar5;
        in_stack_ffffffffffffffd0->IsVisible = bVar5;
        in_stack_ffffffffffffffd0->SortOrder = pIVar3->SortOrder;
        in_stack_ffffffffffffffd0->SortDirection = pIVar3->field_0xb & 3;
      }
      pIVar3 = pIVar3 + 1;
    }
    for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x6c); iVar1 = iVar1 + 1) {
      cVar6 = (char)iVar1;
      ImSpan<ImGuiTableColumn>::operator[]
                ((ImSpan<ImGuiTableColumn> *)in_stack_ffffffffffffffd0,iVar1);
      pcVar4 = ImSpan<signed_char>::operator[]
                         ((ImSpan<signed_char> *)in_stack_ffffffffffffffd0,iVar1);
      *pcVar4 = cVar6;
    }
  }
  return;
}

Assistant:

void ImGui::TableLoadSettings(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    table->IsSettingsRequestLoad = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind settings
    ImGuiTableSettings* settings;
    if (table->SettingsOffset == -1)
    {
        settings = TableSettingsFindByID(table->ID);
        if (settings == NULL)
            return;
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    else
    {
        settings = TableGetBoundSettings(table);
    }
    table->SettingsLoadedFlags = settings->SaveFlags;
    table->RefScale = settings->RefScale;
    //IM_ASSERT(settings->ColumnsCount == table->ColumnsCount);

    // Serialize ImGuiTableSettings/ImGuiTableColumnSettings into ImGuiTable/ImGuiTableColumn
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();
    for (int data_n = 0; data_n < settings->ColumnsCount; data_n++, column_settings++)
    {
        int column_n = column_settings->Index;
        if (column_n < 0 || column_n >= table->ColumnsCount)
            continue;

        ImGuiTableColumn* column = &table->Columns[column_n];
        if (settings->SaveFlags & ImGuiTableFlags_Resizable)
        {
            if (column_settings->IsStretch)
                column->WidthStretchWeight = column_settings->WidthOrWeight;
            else
                column->WidthRequest = column_settings->WidthOrWeight;
            column->AutoFitQueue = 0x00;
        }
        if (settings->SaveFlags & ImGuiTableFlags_Reorderable)
            column->DisplayOrder = column_settings->DisplayOrder;
        else
            column->DisplayOrder = (ImS8)column_n;
        column->IsVisible = column->IsVisibleNextFrame = column_settings->IsVisible;
        column->SortOrder = column_settings->SortOrder;
        column->SortDirection = column_settings->SortDirection;
    }

    // FIXME-TABLE: Need to validate .ini data
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImS8)column_n;
}